

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderVariableManagerGL::StorageBufferBindInfo::SetDynamicOffset
          (StorageBufferBindInfo *this,Uint32 ArrayIndex,Uint32 Offset)

{
  undefined8 ResDesc;
  ResourceAttribs *pRVar1;
  Char *Message;
  CachedSSBO *this_00;
  BufferViewGLImpl *pObject;
  char (*in_RCX) [109];
  CachedSSBO *CachedSSBO;
  undefined1 local_48 [8];
  string msg;
  PipelineResourceDesc *Desc;
  ResourceAttribs *Attr;
  Uint32 Offset_local;
  Uint32 ArrayIndex_local;
  StorageBufferBindInfo *this_local;
  
  pRVar1 = GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>::GetAttribs
                     (&this->
                       super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                     );
  msg.field_2._8_8_ =
       ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
       ::GetDesc((ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                  *)this);
  if ((((PipelineResourceDesc *)msg.field_2._8_8_)->ResourceType != SHADER_RESOURCE_TYPE_BUFFER_SRV)
     && (((PipelineResourceDesc *)msg.field_2._8_8_)->ResourceType !=
         SHADER_RESOURCE_TYPE_BUFFER_UAV)) {
    FormatString<char[26],char[109]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV || Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV"
               ,in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"SetDynamicOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x17d);
    std::__cxx11::string::~string((string *)local_48);
  }
  this_00 = ShaderResourceCacheGL::GetConstSSBO
                      ((((this->
                         super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                         ).
                         super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                        .m_ParentManager)->
                       super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
                       m_ResourceCache,pRVar1->CacheOffset + ArrayIndex);
  ResDesc = msg.field_2._8_8_;
  pObject = Diligent::RefCntAutoPtr::operator_cast_to_BufferViewGLImpl_((RefCntAutoPtr *)this_00);
  VerifyDynamicBufferOffset<Diligent::BufferGLImpl,Diligent::BufferViewGLImpl>
            ((PipelineResourceDesc *)ResDesc,(IDeviceObject *)pObject,0,0,(ulong)Offset);
  ShaderResourceCacheGL::SetDynamicSSBOOffset
            ((((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
               ).
               super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
              .m_ParentManager)->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>
             ).m_ResourceCache,pRVar1->CacheOffset + ArrayIndex,Offset);
  return;
}

Assistant:

void ShaderVariableManagerGL::StorageBufferBindInfo::SetDynamicOffset(Uint32 ArrayIndex, Uint32 Offset)
{
    const auto& Attr = GetAttribs();
    const auto& Desc = GetDesc();
    VERIFY_EXPR(Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV ||
                Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV);
#ifdef DILIGENT_DEVELOPMENT
    {
        const auto& CachedSSBO = m_ParentManager.m_ResourceCache.GetConstSSBO(Attr.CacheOffset + ArrayIndex);
        VerifyDynamicBufferOffset<BufferGLImpl, BufferViewGLImpl>(Desc, CachedSSBO.pBufferView, 0, 0, Offset);
    }
#endif

    m_ParentManager.m_ResourceCache.SetDynamicSSBOOffset(Attr.CacheOffset + ArrayIndex, Offset);
}